

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSmallDeterminant.cpp
# Opt level: O2

HaF64 Determinant2x2(HaF64 (*matrix) [2],HaF64 *error)

{
  HaF64 HVar1;
  bool bVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar5 = vpermilpd_avx((undefined1  [16])matrix[1],1);
  auVar7._0_8_ = auVar5._0_8_ * (double)(*matrix)[0];
  auVar7._8_8_ = auVar5._8_8_ * (double)(*matrix)[1];
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar5 = vxorpd_avx512vl(auVar7,auVar5);
  uVar3 = vcmppd_avx512vl(auVar5,auVar7,2);
  bVar2 = (bool)((byte)(uVar3 & 3) & 1);
  dVar4 = (double)((ulong)bVar2 * (long)auVar7._0_8_ | (ulong)!bVar2 * auVar5._0_8_);
  uVar3 = (uVar3 & 3) >> 1;
  dVar6 = (double)(uVar3 * (long)auVar7._8_8_ | (ulong)!SUB81(uVar3,0) * auVar5._8_8_);
  auVar8._0_8_ = dVar4 + dVar6;
  auVar8._8_8_ = dVar4 + dVar6;
  auVar5 = vhsubpd_avx(auVar7,auVar7);
  HVar1 = (HaF64)vmovlpd_avx(auVar8);
  *error = HVar1;
  return auVar5._0_8_;
}

Assistant:

hacd::HaF64 Determinant2x2 (const hacd::HaF64 matrix[2][2], hacd::HaF64* const error)
{
	hacd::HaF64 a00xa11 = matrix[0][0] * matrix[1][1];
	hacd::HaF64 a01xa10 = matrix[0][1] * matrix[1][0];
	*error = Absolute(a00xa11) + Absolute(a01xa10);
	return a00xa11 - a01xa10;
}